

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O1

int __thiscall
Saturation::PredicateSplitPassiveClauseContainer::remove
          (PredicateSplitPassiveClauseContainer *this,char *__filename)

{
  pointer pfVar1;
  __uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  _Var2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  pointer puVar7;
  uint uVar8;
  HandlerList *pHVar9;
  float extraout_XMM0_Da;
  
  (*(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.super_ClauseContainer.
    _vptr_ClauseContainer[0x14])();
  pfVar1 = (this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(this->_cutoffs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar6 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if (extraout_XMM0_Da <= pfVar1[uVar5]) break;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < (ulong)(lVar6 >> 2));
  }
  uVar8 = (uint)uVar5;
  if (this->_layeredArrangement == true) {
    puVar7 = (this->_queues).
             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)((long)(this->_queues).
                              super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3)) {
      do {
        uVar8 = uVar8 + 1;
        _Var2._M_t.
        super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
        .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
             puVar7[uVar5]._M_t.
             super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ._M_t;
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                              .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                              _M_head_impl + 0x20))
                  (_Var2._M_t.
                   super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                   .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl,
                   __filename);
        uVar5 = (ulong)uVar8;
        puVar7 = (this->_queues).
                 super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->_queues).
                                     super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3)
              );
    }
  }
  else {
    _Var2._M_t.
    super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
    .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
         (this->_queues).
         super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
         super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
         ._M_t;
    uVar5 = (**(code **)(*(long *)_Var2._M_t.
                                  super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                  .
                                  super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>
                                  ._M_head_impl + 0x20))
                      (_Var2._M_t.
                       super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                       .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                       _M_head_impl,__filename);
  }
  pHVar9 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
           super_ClauseContainer.removedEvent.super_BaseEvent._handlers;
  bVar3 = pHVar9 != (HandlerList *)0x0 & (this->super_PassiveClauseContainer)._isOutermost;
  iVar4 = (int)CONCAT71((int7)(uVar5 >> 8),bVar3);
  if (bVar3 == 1) {
    do {
      iVar4 = (*pHVar9->_head->_vptr_HandlerStruct[2])(pHVar9->_head,__filename);
      pHVar9 = pHVar9->_tail;
    } while (pHVar9 != (List<Lib::BaseEvent::HandlerStruct_*> *)0x0);
  }
  return iVar4;
}

Assistant:

void PredicateSplitPassiveClauseContainer::remove(Clause* cl)
{
  if (_isOutermost)
  {
    ASS(cl->store()==Clause::PASSIVE);
  }
  auto bestQueueIndex = bestQueue(evaluateFeature(cl));

  if (_layeredArrangement)
  {
    // remove clause from all queues starting from best queue for clause
    for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
    {
      _queues[i]->remove(cl);
    }
  }
  else
  {
    // remove clause from best queue for clause
    _queues[bestQueueIndex]->remove(cl);
  }

  if (_isOutermost)
  {
    ASS(cl->store()==Clause::PASSIVE);
    removedEvent.fire(cl);
    ASS(cl->store() != Clause::PASSIVE);
  }
}